

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content<httplib::Response>(Stream *strm,Response *x,Progress *progress)

{
  Progress *pPVar1;
  Response *strm_00;
  bool bVar2;
  int iVar3;
  size_t len_00;
  char *local_80;
  char **local_78;
  char **encoding_1;
  function<bool_(unsigned_long,_unsigned_long)> local_60;
  char *local_40;
  char **local_38;
  char **encoding;
  Progress *pPStack_28;
  int len;
  Progress *progress_local;
  Response *x_local;
  Stream *strm_local;
  
  pPStack_28 = progress;
  progress_local = (Progress *)x;
  x_local = (Response *)strm;
  bVar2 = has_header(&x->headers,"Content-Length");
  if (bVar2) {
    encoding._4_4_ =
         get_header_value_int
                   ((Headers *)((long)&progress_local[1].super__Function_base._M_functor + 8),
                    "Content-Length",0);
    if (encoding._4_4_ == 0) {
      local_40 = get_header_value((Headers *)
                                  ((long)&progress_local[1].super__Function_base._M_functor + 8),
                                  "Transfer-Encoding",0,"");
      local_38 = &local_40;
      iVar3 = strcasecmp(local_40,"chunked");
      if (iVar3 == 0) {
        strm_local._7_1_ =
             read_content_chunked((Stream *)x_local,(string *)&progress_local[2]._M_invoker);
        goto LAB_0020755a;
      }
    }
    strm_00 = x_local;
    pPVar1 = progress_local + 2;
    len_00 = (size_t)encoding._4_4_;
    std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_60,progress);
    strm_local._7_1_ =
         read_content_with_length((Stream *)strm_00,(string *)&pPVar1->_M_invoker,len_00,&local_60);
    std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_60);
  }
  else {
    local_80 = get_header_value((Headers *)
                                ((long)&progress_local[1].super__Function_base._M_functor + 8),
                                "Transfer-Encoding",0,"");
    local_78 = &local_80;
    iVar3 = strcasecmp(local_80,"chunked");
    if (iVar3 == 0) {
      strm_local._7_1_ =
           read_content_chunked((Stream *)x_local,(string *)&progress_local[2]._M_invoker);
    }
    else {
      strm_local._7_1_ =
           read_content_without_length((Stream *)x_local,(string *)&progress_local[2]._M_invoker);
    }
  }
LAB_0020755a:
  return (bool)(strm_local._7_1_ & 1);
}

Assistant:

bool read_content(Stream& strm, T& x, Progress progress = Progress())
{
    if (has_header(x.headers, "Content-Length")) {
        auto len = get_header_value_int(x.headers, "Content-Length", 0);
        if (len == 0) {
            const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", 0, "");
            if (!strcasecmp(encoding, "chunked")) {
                return read_content_chunked(strm, x.body);
            }
        }
        return read_content_with_length(strm, x.body, len, progress);
    } else {
        const auto& encoding = get_header_value(x.headers, "Transfer-Encoding", 0, "");
        if (!strcasecmp(encoding, "chunked")) {
            return read_content_chunked(strm, x.body);
        }
        return read_content_without_length(strm, x.body);
    }
    return true;
}